

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  ImVec2 local_70;
  uint local_64;
  ImVec4 local_58;
  ImVec2 local_48;
  ImVec2 sz;
  char *text_end;
  int ca;
  int cb;
  int cg;
  int cr;
  ImGuiContext *g;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *text_local;
  
  pIVar1 = GImGui;
  fVar5 = ImSaturate(*col);
  uVar2 = (uint)(fVar5 * 255.0 + 0.5);
  fVar5 = ImSaturate(col[1]);
  uVar3 = (uint)(fVar5 * 255.0 + 0.5);
  fVar5 = ImSaturate(col[2]);
  uVar4 = (uint)(fVar5 * 255.0 + 0.5);
  if ((flags & 2U) == 0) {
    fVar5 = ImSaturate(col[3]);
    local_64 = (uint)(fVar5 * 255.0 + 0.5);
  }
  else {
    local_64 = 0xff;
  }
  BeginTooltipEx(0,true);
  if (text == (char *)0x0) {
    local_70.x = 0.0;
    local_70.y = 0.0;
  }
  else {
    local_70 = (ImVec2)FindRenderedTextEnd(text,(char *)0x0);
  }
  sz = local_70;
  if (text < (ulong)local_70) {
    TextUnformatted(text,(char *)local_70);
    Separator();
  }
  fVar5 = (pIVar1->Style).FramePadding.y;
  fVar5 = pIVar1->FontSize * 3.0 + fVar5 + fVar5;
  ImVec2::ImVec2(&local_48,fVar5,fVar5);
  ImVec4::ImVec4(&local_58,*col,col[1],col[2],col[3]);
  ColorButton("##preview",&local_58,flags & 0x60002U | 0x40,local_48);
  SameLine(0.0,-1.0);
  if ((flags & 2U) == 0) {
    Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",(double)*col,
         (double)col[1],(double)col[2],(double)col[3],(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
         (ulong)local_64,(ulong)uVar2,uVar3,uVar4,local_64);
  }
  else {
    Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",(double)*col,(double)col[1],
         (double)col[2],(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2,(ulong)uVar3,uVar4);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    BeginTooltipEx(0, true);

    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextUnformatted(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ColorButton("##preview", ImVec4(col[0], col[1], col[2], col[3]), (flags & (ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if (flags & ImGuiColorEditFlags_NoAlpha)
        Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
    else
        Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    EndTooltip();
}